

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O3

bool __thiscall
Rml::ElementUtilities::GetBoundingBox
          (ElementUtilities *this,Rectanglef *out_rectangle,Element *element,BoxArea box_area)

{
  float fVar1;
  long lVar2;
  code *pcVar3;
  Vector2f a;
  undefined1 auVar4 [16];
  byte bVar5;
  BoxArea BVar6;
  bool bVar7;
  int i;
  Property *pPVar8;
  Box *this_00;
  TransformState *this_01;
  Matrix4f *rhs;
  Context *this_02;
  Vector2i VVar9;
  byte bVar10;
  BoxArea area;
  BoxShadow *shadow;
  long lVar11;
  int i_1;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector2f VVar17;
  Vector2f VVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  Vector2f VVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  Vector2f corners [4];
  Matrix4f project_transform;
  ThisType result;
  Vector2f local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  undefined1 local_d8 [16];
  Vector2f local_c8;
  Vector2f VStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  MatrixAType local_68;
  undefined1 auVar25 [16];
  
  if ((out_rectangle == (Rectanglef *)0x0) &&
     (bVar7 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                     ,0x104), !bVar7)) {
LAB_00232fed:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  local_d8._0_8_ = 0;
  BVar6 = (BoxArea)element;
  if ((BoxArea)element == Auto) {
    pPVar8 = Element::GetLocalProperty((Element *)out_rectangle,BoxShadow);
    area = Border;
    BVar6 = Border;
    if (pPVar8 != (Property *)0x0) {
      if (((pPVar8->value).type != BOXSHADOWLIST) &&
         (bVar7 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                         ,0x10f), !bVar7)) goto LAB_00232fed;
      lVar11 = *(long *)(pPVar8->value).data;
      lVar2 = *(long *)((pPVar8->value).data + 8);
      if (lVar11 != lVar2) {
        local_108.x = 0.0;
        local_108.y = 0.0;
        local_d8 = ZEXT816(0);
        do {
          if (*(char *)(lVar11 + 0x24) == '\0') {
            fVar14 = Element::ResolveLength
                               ((Element *)out_rectangle,*(NumericValue *)(lVar11 + 0x14));
            fVar15 = Element::ResolveLength
                               ((Element *)out_rectangle,*(NumericValue *)(lVar11 + 0x1c));
            fVar15 = fVar14 * 1.5 + fVar15;
            fVar14 = Element::ResolveLength((Element *)out_rectangle,*(NumericValue *)(lVar11 + 4));
            fVar16 = Element::ResolveLength
                               ((Element *)out_rectangle,*(NumericValue *)(lVar11 + 0xc));
            VVar17.x = fVar15 - fVar14;
            VVar17.y = fVar15 - fVar16;
            local_108 = Math::Max<Rml::Vector2<float>>(local_108,VVar17);
            VVar18.x = fVar14 + fVar15;
            VVar18.y = fVar16 + fVar15;
            VVar17 = Math::Max<Rml::Vector2<float>>((Vector2f)local_d8._0_8_,VVar18);
            local_d8._8_4_ = extraout_XMM0_Dc;
            local_d8._0_4_ = VVar17.x;
            local_d8._4_4_ = VVar17.y;
            local_d8._12_4_ = extraout_XMM0_Dd;
          }
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != lVar2);
        goto LAB_00232d51;
      }
    }
  }
  area = BVar6;
  local_108.x = 0.0;
  local_108.y = 0.0;
LAB_00232d51:
  VVar17 = Element::GetAbsoluteOffset((Element *)out_rectangle,area);
  this_00 = Element::GetBox((Element *)out_rectangle);
  VVar18 = Box::GetSize(this_00,area);
  local_f8 = VVar17.x;
  fStack_f4 = VVar17.y;
  uStack_100._0_4_ = VVar18.x + local_f8 + (float)local_d8._0_4_;
  uStack_100._4_4_ = VVar18.y + fStack_f4 + (float)local_d8._4_4_;
  local_108.x = local_f8 - local_108.x;
  local_108.y = fStack_f4 - local_108.y;
  this_01 = Element::GetTransformState((Element *)out_rectangle);
  if ((this_01 == (TransformState *)0x0) ||
     (rhs = TransformState::GetTransform(this_01), rhs == (Matrix4f *)0x0)) {
    *(Vector2f *)this = local_108;
    *(undefined8 *)(this + 8) = uStack_100;
    bVar7 = true;
  }
  else {
    this_02 = Element::GetContext((Element *)out_rectangle);
    if (this_02 == (Context *)0x0) {
      bVar7 = false;
    }
    else {
      local_c8.x = local_108.x;
      local_c8.y = local_108.y;
      VStack_c0.x = (float)uStack_100;
      VStack_c0.y = local_108.y;
      local_b8 = (float)uStack_100;
      fStack_b4 = uStack_100._4_4_;
      fStack_b0 = local_108.x;
      fStack_ac = uStack_100._4_4_;
      VVar9 = Context::GetDimensions(this_02);
      local_68.vectors[0].y = 0.0;
      local_68.vectors[0].z = 0.0;
      local_68.vectors[0].w = 0.0;
      local_68.vectors[1].x = 0.0;
      local_68.vectors[1].z = 0.0;
      local_68.vectors[1].w = 0.0;
      local_68.vectors[2].x = 0.0;
      local_68.vectors[2].y = 0.0;
      fVar14 = (float)VVar9.x;
      fVar15 = (float)VVar9.y;
      auVar19._0_8_ = CONCAT44(fVar15,fVar14) ^ 0x8000000080000000;
      auVar19._8_4_ = 0x80000000;
      auVar19._12_4_ = 0x80000000;
      auVar20._4_4_ = fVar15;
      auVar20._0_4_ = fVar14;
      auVar20._8_8_ = 0;
      auVar20 = divps(auVar19,auVar20);
      local_68.vectors[3].x = auVar20._0_4_;
      local_68.vectors[3].y = auVar20._4_4_;
      local_68.vectors[2].z = 0.0001;
      local_68.vectors[2].w = 0.0;
      local_68.vectors[3].z = -0.0;
      local_68.vectors[3].w = 1.0;
      local_68.vectors[0].x = 2.0 / fVar14;
      local_68.vectors[1].y = 2.0 / fVar15;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(&local_68,rhs);
      lVar11 = 0;
      bVar10 = 0;
      do {
        bVar5 = bVar10;
        fVar16 = (&local_c8)[lVar11].x;
        fVar1 = (&local_c8)[lVar11].y;
        fVar21 = fVar16 * (float)local_a0 + fVar1 * (float)local_90 + (float)local_80 * 0.0 +
                 (float)local_70;
        fVar22 = fVar16 * (float)((ulong)local_a0 >> 0x20) +
                 fVar1 * (float)((ulong)local_90 >> 0x20) + (float)((ulong)local_80 >> 0x20) * 0.0 +
                 (float)((ulong)local_70 >> 0x20);
        auVar24._0_4_ =
             fVar16 * (float)local_a8 + fVar1 * (float)local_98 + (float)local_88 * 0.0 +
             (float)local_78;
        auVar24._4_4_ =
             fVar16 * (float)((ulong)local_a8 >> 0x20) + fVar1 * (float)((ulong)local_98 >> 0x20) +
             (float)((ulong)local_88 >> 0x20) * 0.0 + (float)((ulong)local_78 >> 0x20);
        auVar24._8_4_ = fVar16 * 0.0 + fVar1 * 0.0 + 0.0 + 0.0;
        auVar24._12_4_ = fVar16 * 0.0 + fVar1 * 0.0 + 0.0 + 0.0;
        auVar4._4_4_ = fVar22;
        auVar4._0_4_ = fVar22;
        auVar4._8_4_ = fVar22;
        auVar4._12_4_ = fVar22;
        auVar20 = divps(auVar24,auVar4);
        VVar23.x = (auVar20._0_4_ + 1.0) * fVar14 * 0.5;
        VVar23.y = (auVar20._4_4_ + 1.0) * fVar15 * 0.5;
        (&local_c8)[lVar11] = VVar23;
        iVar12 = -(uint)(fVar21 < -fVar22);
        iVar13 = -(uint)(fVar22 < fVar21);
        auVar26._4_4_ = iVar13;
        auVar26._0_4_ = iVar12;
        auVar26._8_4_ = iVar13;
        auVar26._12_4_ = iVar13;
        auVar25._8_8_ = auVar26._8_8_;
        auVar25._4_4_ = iVar12;
        auVar25._0_4_ = iVar12;
        iVar12 = movmskpd(box_area,auVar25);
        bVar7 = iVar12 != 0;
        box_area = CONCAT31((int3)((uint)iVar12 >> 8),bVar7);
        bVar10 = bVar5 | bVar7;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if (!(bool)(bVar5 | bVar7)) {
        *(float *)this = local_c8.x;
        *(float *)(this + 4) = local_c8.y;
        *(float *)(this + 8) = local_c8.x;
        *(float *)(this + 0xc) = local_c8.y;
        lVar11 = 1;
        local_108.x = local_c8.x;
        local_108.y = local_c8.y;
        do {
          VVar17 = (&local_c8)[lVar11];
          a.y = local_108.y;
          a.x = local_108.x;
          VVar18 = Math::Min<Rml::Vector2<float>>(a,VVar17);
          VVar17 = Math::Max<Rml::Vector2<float>>(*(Vector2f *)(this + 8),VVar17);
          local_108.x = VVar18.x;
          local_108.y = VVar18.y;
          *(float *)this = local_108.x;
          *(float *)(this + 4) = local_108.y;
          *(Vector2f *)(this + 8) = VVar17;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
      }
      bVar7 = (bool)(bVar10 ^ 1);
    }
  }
  return bVar7;
}

Assistant:

bool ElementUtilities::GetBoundingBox(Rectanglef& out_rectangle, Element* element, BoxArea box_area)
{
	RMLUI_ASSERT(element);

	Vector2f shadow_extent_top_left, shadow_extent_bottom_right;
	if (box_area == BoxArea::Auto)
	{
		// 'Auto' acts like border box extended to encompass any ink overflow, including the element's box-shadow.
		// Note: Does not currently include ink overflow due to filters, as that is handled manually in ElementEffects.
		box_area = BoxArea::Border;

		if (const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow))
		{
			RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
			const BoxShadowList& shadow_list = p_box_shadow->value.GetReference<BoxShadowList>();

			for (const BoxShadow& shadow : shadow_list)
			{
				if (!shadow.inset)
				{
					const float extent = 1.5f * element->ResolveLength(shadow.blur_radius) + element->ResolveLength(shadow.spread_distance);
					const Vector2f offset = {element->ResolveLength(shadow.offset_x), element->ResolveLength(shadow.offset_y)};

					shadow_extent_top_left = Math::Max(shadow_extent_top_left, -offset + Vector2f(extent));
					shadow_extent_bottom_right = Math::Max(shadow_extent_bottom_right, offset + Vector2f(extent));
				}
			}
		}
	}

	// Element bounds in non-transformed space.
	Rectanglef bounds = Rectanglef::FromPositionSize(element->GetAbsoluteOffset(box_area), element->GetBox().GetSize(box_area));
	bounds = bounds.Extend(shadow_extent_top_left, shadow_extent_bottom_right);

	const TransformState* transform_state = element->GetTransformState();
	const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);

	// Early exit in the common case of no transform.
	if (!transform)
	{
		out_rectangle = bounds;
		return true;
	}

	Context* context = element->GetContext();
	if (!context)
		return false;

	constexpr int num_corners = 4;
	Vector2f corners[num_corners] = {
		bounds.TopLeft(),
		bounds.TopRight(),
		bounds.BottomRight(),
		bounds.BottomLeft(),
	};

	// Transform and project corners to window coordinates.
	constexpr float z_clip = 10'000.f;
	const Vector2f window_size = Vector2f(context->GetDimensions());
	const Matrix4f project = Matrix4f::ProjectOrtho(0.f, window_size.x, 0.f, window_size.y, -z_clip, z_clip);
	const Matrix4f project_transform = project * (*transform);
	bool any_vertex_depth_clipped = false;

	for (int i = 0; i < num_corners; i++)
	{
		const Vector4f pos_clip_space = project_transform * Vector4f(corners[i].x, corners[i].y, 0, 1);
		const Vector2f pos_ndc = Vector2f(pos_clip_space.x, pos_clip_space.y) / pos_clip_space.w;
		const Vector2f pos_viewport = 0.5f * window_size * (pos_ndc + Vector2f(1));
		corners[i] = pos_viewport;
		any_vertex_depth_clipped |= !(-pos_clip_space.w <= pos_clip_space.z && pos_clip_space.z <= pos_clip_space.w);
	}

	// If any part of the box area is outside the depth clip planes we give up finding the bounding box. In this situation a renderer would normally
	// clip the underlying triangles against the clip planes. We could in principle do the same, but the added complexity does not seem worthwhile for
	// our use cases.
	if (any_vertex_depth_clipped)
		return false;

	// Find the rectangle covering the projected corners.
	out_rectangle = Rectanglef::FromPosition(corners[0]);
	for (int i = 1; i < num_corners; i++)
		out_rectangle = out_rectangle.Join(corners[i]);

	return true;
}